

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

UnknownField __thiscall google::protobuf::UnknownField::DeepCopy(UnknownField *this,Arena *arena)

{
  ulong uVar1;
  pointer pcVar2;
  anon_union_8_5_2195ba05_for_data_ this_00;
  anon_union_8_5_2195ba05_for_data_ other;
  UnknownField UVar3;
  
  uVar1._0_4_ = this->number_;
  uVar1._4_4_ = this->type_;
  other = (anon_union_8_5_2195ba05_for_data_)(this->data_).string_value;
  if (uVar1 >> 0x20 == 4) {
    if (arena == (Arena *)0x0) {
      this_00.string_value = (string *)operator_new(0x10);
      ((this_00.string_value)->_M_dataplus)._M_p = (pointer)0x0;
    }
    else {
      this_00.string_value = (string *)Arena::Allocate(arena,0x10);
      internal::ShortSooRep::ShortSooRep((ShortSooRep *)this_00.string_value,arena);
      other = (anon_union_8_5_2195ba05_for_data_)(this->data_).group;
    }
    UnknownFieldSet::MergeFrom(this_00.group,other.group);
  }
  else {
    this_00 = other;
    if (uVar1._4_4_ == 3) {
      if (arena == (Arena *)0x0) {
        this_00.string_value = (string *)operator_new(0x20);
        ((this_00.string_value)->_M_dataplus)._M_p = (pointer)&(this_00.string_value)->field_2;
        pcVar2 = ((other.string_value)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)this_00.varint,pcVar2,
                   pcVar2 + (long)*(anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                                   &(other.string_value)->_M_string_length);
      }
      else {
        this_00.string_value =
             (string *)internal::ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
        ((this_00.string_value)->_M_dataplus)._M_p = (pointer)&(this_00.string_value)->field_2;
        pcVar2 = ((other.string_value)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)this_00.varint,pcVar2,
                   pcVar2 + (long)*(anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                                   &(other.string_value)->_M_string_length);
      }
    }
  }
  UVar3.data_.varint = this_00.varint;
  UVar3.number_ = (undefined4)uVar1;
  UVar3.type_ = uVar1._4_4_;
  return UVar3;
}

Assistant:

UnknownField UnknownField::DeepCopy(Arena* arena) const {
  UnknownField copy = *this;
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      copy.data_.string_value =
          Arena::Create<std::string>(arena, *data_.string_value);
      break;
    case UnknownField::TYPE_GROUP: {
      UnknownFieldSet* group = Arena::Create<UnknownFieldSet>(arena);
      group->MergeFrom(*data_.group);
      copy.data_.group = group;
      break;
    }
    default:
      break;
  }
  return copy;
}